

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleRemove
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse)

{
  pointer pbVar1;
  bool bVar2;
  pointer __rhs;
  string message;
  string fileName;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    __rhs = __rhs + 1;
    if (__rhs == pbVar1) {
      std::__cxx11::string::~string((string *)&local_90);
      return true;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)__rhs);
    bVar2 = cmsys::SystemTools::FileIsFullPath(&local_50);
    if (!bVar2) {
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::_M_assign((string *)&local_50);
      std::operator+(&local_70,"/",__rhs);
      std::__cxx11::string::append((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_50);
    if (bVar2) {
      bVar2 = cmsys::SystemTools::FileIsSymlink(&local_50);
      if (bVar2 || !recurse) goto LAB_001ce437;
      cmsys::SystemTools::RemoveADirectory(&local_50);
    }
    else {
LAB_001ce437:
      cmsys::SystemTools::RemoveFile(&local_50);
    }
    std::__cxx11::string::~string((string *)&local_50);
  } while( true );
}

Assistant:

bool cmFileCommand::HandleRemove(std::vector<std::string> const& args,
                                 bool recurse)
{

  std::string message;

  for (std::string const& arg :
       cmMakeRange(args).advance(1)) // Get rid of subcommand
  {
    std::string fileName = arg;
    if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
      fileName = this->Makefile->GetCurrentSourceDirectory();
      fileName += "/" + arg;
    }

    if (cmSystemTools::FileIsDirectory(fileName) &&
        !cmSystemTools::FileIsSymlink(fileName) && recurse) {
      cmSystemTools::RemoveADirectory(fileName);
    } else {
      cmSystemTools::RemoveFile(fileName);
    }
  }
  return true;
}